

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# purearrayfactory.cpp
# Opt level: O0

Array * __thiscall PureArrayFactory::getPureArray(PureArrayFactory *this,int v)

{
  Array *this_00;
  int v_local;
  PureArrayFactory *this_local;
  
  if ((v < 0) || (this->_range <= v)) {
    this_local = (PureArrayFactory *)0x0;
  }
  else {
    if (this->_arrays[v] == (Array *)0x0) {
      this_00 = (Array *)operator_new(0x18);
      PureArray::PureArray((PureArray *)this_00,v,this->_width,this->_height);
      this->_arrays[v] = this_00;
    }
    this_local = (PureArrayFactory *)this->_arrays[v];
  }
  return (Array *)this_local;
}

Assistant:

Array* PureArrayFactory::getPureArray(int v)
{
	if (v < 0 || v >= _range)
		return NULL;

	if (_arrays[v] == NULL) {
		_arrays[v] = new PureArray(v, _width, _height);
	}

	return _arrays[v];
}